

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

string * bin_str_to_hex(string *__return_storage_ptr__,string *str)

{
  size_type sVar1;
  long lVar2;
  ostream *poVar3;
  size_type sVar4;
  ostringstream ret;
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ret);
  sVar1 = str->_M_string_length;
  for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
    *(uint *)((long)auStack_190 + *(long *)(_ret + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_ret + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::operator<<((ostringstream *)&ret,0x30);
    lVar2 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string bin_str_to_hex(const std::string &str) {
    std::ostringstream ret;

    for (uint8_t i : str) {
        uint32_t c = static_cast<uint32_t>(i);
        ret << std::hex << std::setfill('0') << std::setw(2) << std::uppercase
            << c;
    }
    return ret.str();
}